

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O3

char * vrna_seq_ungapped(char *seq)

{
  int iVar1;
  byte *p;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  
  pcVar2 = (char *)0x0;
  if (seq != (char *)0x0) {
    p = (byte *)strdup(seq);
    bVar4 = *p;
    pbVar3 = p;
    do {
      pbVar3 = pbVar3 + 1;
      if (((1 < bVar4 - 0x2d) && (bVar4 != 0x5f)) && (bVar4 != 0x7e)) {
        p[(int)pcVar2] = bVar4;
        pcVar2 = (char *)(ulong)((int)pcVar2 + 1);
      }
      bVar4 = *pbVar3;
    } while (bVar4 != 0);
    iVar1 = (int)pcVar2;
    pcVar2 = (char *)vrna_realloc(p,iVar1 + 1);
    pcVar2[iVar1] = '\0';
  }
  return pcVar2;
}

Assistant:

PUBLIC char *
vrna_seq_ungapped(const char *seq)
{
  char  *tmp_sequence, *b;
  int   i;

  tmp_sequence = NULL;

  if (seq) {
    tmp_sequence = strdup(seq);

    b = tmp_sequence;
    i = 0;
    do {
      if ((*b == '-') || (*b == '_') || (*b == '~') || (*b == '.'))
        continue;

      tmp_sequence[i] = *b;
      i++;
    } while (*(++b));

    tmp_sequence    = (char *)vrna_realloc(tmp_sequence, (i + 1) * sizeof(char));
    tmp_sequence[i] = '\0';
  }

  return tmp_sequence;
}